

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTestInstance::GraphicsCacheTestInstance
          (GraphicsCacheTestInstance *this,Context *context,CacheTestParam *param)

{
  Move<vk::Handle<(vk::HandleType)13>_> *this_00;
  SimpleGraphicsPipelineBuilder_conflict *this_01;
  Move<vk::Handle<(vk::HandleType)17>_> *this_02;
  Move<vk::Handle<(vk::HandleType)9>_> *this_03;
  Move<vk::Handle<(vk::HandleType)13>_> *this_04;
  Move<vk::Handle<(vk::HandleType)13>_> *this_05;
  VkBool32 VVar1;
  VkBool32 VVar2;
  VkShaderStageFlagBits stage;
  pointer __src;
  Allocation *pAVar3;
  deUint64 dVar4;
  CacheTestParam *pCVar5;
  int iVar6;
  VkDevice pVVar7;
  VkAllocationCallbacks *pVVar8;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc;
  VkDevice device;
  VkPhysicalDeviceFeatures *pVVar9;
  NotSupportedError *this_06;
  char *entryName;
  char *pcVar10;
  char *pcVar11;
  VkSubpassDescription subpassDescription;
  VkRenderPassCreateInfo renderPassParams;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_98;
  VkImageView attachmentBindInfos [2];
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  Vector<unsigned_int,_2> local_40;
  Vector<unsigned_int,_2> local_38;
  
  CacheTestInstance::CacheTestInstance(&this->super_CacheTestInstance,context,param);
  (this->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__GraphicsCacheTestInstance_00bfa180;
  *(undefined8 *)(this->m_renderSize).m_data = 0x2000000020;
  this->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_depthFormat = VK_FORMAT_D16_UNORM;
  iVar6 = (int)this;
  this->m_colorImageAlloc[0].super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  this->m_colorImageAlloc[1].super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  this_00 = &this->m_depthAttachmentView;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = &this->m_pipelineBuilder;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_depthImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_vertexBufferMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  (this->m_pipelineBuilder).m_context = context;
  (this->m_pipelineBuilder).m_patchControlPoints = 0;
  memset((this->m_pipelineBuilder).m_shaderModules,0,0xc4);
  this_02 = &this->m_renderPass;
  memset(this_02,0,0x120);
  pAlloc = (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
           Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context)
  ;
  device = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  createBufferAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&subpassDescription,
             (this->super_CacheTestInstance).super_TestInstance.m_context,0x400,0x80,
             &this->m_vertexBufferMemory);
  pipelineLayoutParams._16_8_ = subpassDescription.pInputAttachments;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)subpassDescription._24_8_;
  pipelineLayoutParams.sType = subpassDescription.flags;
  pipelineLayoutParams._4_4_ = subpassDescription.pipelineBindPoint;
  pipelineLayoutParams.pNext = (void *)subpassDescription._8_8_;
  subpassDescription.flags = 0;
  subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDescription.inputAttachmentCount = 0;
  subpassDescription._12_4_ = 0;
  subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
  subpassDescription.colorAttachmentCount = 0;
  subpassDescription._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)pipelineLayoutParams._16_8_;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineLayoutParams.pSetLayouts;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       pipelineLayoutParams._0_8_;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&subpassDescription);
  createOverlappingQuads();
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  _M_move_assign(&this->m_vertices,&pipelineLayoutParams);
  std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  ~_Vector_base((_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 *)&pipelineLayoutParams);
  __src = (this->m_vertices).
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_start;
  memcpy(((this->m_vertexBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,__src,
         (long)(this->m_vertices).
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__src);
  pAVar3 = (this->m_vertexBufferMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pAlloc,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,
             pAVar3->m_offset,0x400);
  pipelineLayoutParams.pPushConstantRanges._0_4_ = this->m_depthFormat;
  pipelineLayoutParams._0_8_ = (ulong)this->m_colorFormat << 0x20;
  pipelineLayoutParams.pNext = (void *)0x100000001;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 2;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)0x200000001;
  pipelineLayoutParams.pushConstantRangeCount = 2;
  pipelineLayoutParams._36_4_ = 0;
  subpassDescription.flags = 0;
  subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDescription._8_8_ = subpassDescription._8_8_ & 0xffffffff00000000;
  pipelineLayoutParams.pPushConstantRanges._4_4_ = 1;
  subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
  subpassDescription.pColorAttachments = &colorAttachmentReference;
  subpassDescription.pDepthStencilAttachment = &depthAttachmentReference;
  renderPassParams.subpassCount = 1;
  subpassDescription.colorAttachmentCount = 1;
  subpassDescription.pResolveAttachments = (VkAttachmentReference *)0x0;
  subpassDescription.preserveAttachmentCount = 0;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  renderPassParams.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 2;
  subpassDescription.pPreserveAttachments = (deUint32 *)0x0;
  renderPassParams.dependencyCount = 0;
  depthAttachmentReference.attachment = 1;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)&pipelineLayoutParams;
  renderPassParams.pSubpasses = &subpassDescription;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_98,(DeviceInterface *)pAlloc,device,
             &renderPassParams,(VkAllocationCallbacks *)0x0);
  pVVar8 = local_98.m_data.deleter.m_allocator;
  pVVar7 = local_98.m_data.deleter.m_device;
  attachmentBindInfos[0].m_internal = local_98.m_data.object.m_internal;
  attachmentBindInfos[1].m_internal = (deUint64)local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            (&this_02->super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       pVVar7;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       pVVar8;
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       attachmentBindInfos[0].m_internal;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)attachmentBindInfos[1].m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_98);
  createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&subpassDescription,
             (this->super_CacheTestInstance).super_TestInstance.m_context,this->m_colorFormat,
             (this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],0x11,iVar6 + 0xf8,pAlloc)
  ;
  pipelineLayoutParams._16_8_ = subpassDescription.pInputAttachments;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)subpassDescription._24_8_;
  pipelineLayoutParams.sType = subpassDescription.flags;
  pipelineLayoutParams._4_4_ = subpassDescription.pipelineBindPoint;
  pipelineLayoutParams.pNext = (void *)subpassDescription._8_8_;
  subpassDescription.flags = 0;
  subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDescription.inputAttachmentCount = 0;
  subpassDescription._12_4_ = 0;
  subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
  subpassDescription.colorAttachmentCount = 0;
  subpassDescription._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)pipelineLayoutParams._16_8_;
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineLayoutParams.pSetLayouts;
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       pipelineLayoutParams._0_8_;
  this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&subpassDescription);
  createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&subpassDescription,
             (this->super_CacheTestInstance).super_TestInstance.m_context,this->m_colorFormat,
             (this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],0x11,iVar6 + 0x108,pAlloc
            );
  pipelineLayoutParams._16_8_ = subpassDescription.pInputAttachments;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)subpassDescription._24_8_;
  pipelineLayoutParams.sType = subpassDescription.flags;
  pipelineLayoutParams._4_4_ = subpassDescription.pipelineBindPoint;
  pipelineLayoutParams.pNext = (void *)subpassDescription._8_8_;
  subpassDescription.flags = 0;
  subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDescription.inputAttachmentCount = 0;
  subpassDescription._12_4_ = 0;
  subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
  subpassDescription.colorAttachmentCount = 0;
  subpassDescription._28_4_ = 0;
  this_03 = this->m_colorImage + 1;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&this_03->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)pipelineLayoutParams._16_8_;
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineLayoutParams.pSetLayouts;
  (this_03->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
       pipelineLayoutParams._0_8_;
  this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&subpassDescription);
  createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&subpassDescription,
             (this->super_CacheTestInstance).super_TestInstance.m_context,this->m_depthFormat,
             (this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],0x20,iVar6 + 0xe8,pAlloc)
  ;
  pipelineLayoutParams._16_8_ = subpassDescription.pInputAttachments;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)subpassDescription._24_8_;
  pipelineLayoutParams.sType = subpassDescription.flags;
  pipelineLayoutParams._4_4_ = subpassDescription.pipelineBindPoint;
  pipelineLayoutParams.pNext = (void *)subpassDescription._8_8_;
  subpassDescription.flags = 0;
  subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDescription.inputAttachmentCount = 0;
  subpassDescription._12_4_ = 0;
  subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
  subpassDescription.colorAttachmentCount = 0;
  subpassDescription._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)pipelineLayoutParams._16_8_;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineLayoutParams.pSetLayouts;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       pipelineLayoutParams._0_8_;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineLayoutParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&subpassDescription);
  pipelineLayoutParams.pSetLayouts =
       (VkDescriptorSetLayout *)
       this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  this->m_imageLayoutBarriers[0].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[0].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[0].srcAccessMask = 0;
  this->m_imageLayoutBarriers[0].dstAccessMask = 0x100;
  this->m_imageLayoutBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[0].newLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[0].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[0].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[0].image.m_internal = (deUint64)pipelineLayoutParams.pSetLayouts;
  this->m_imageLayoutBarriers[0].subresourceRange.aspectMask = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[0].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[0].subresourceRange.layerCount = 1;
  dVar4 = this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
          m_internal;
  this->m_imageLayoutBarriers[1].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[1].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[1].srcAccessMask = 0;
  this->m_imageLayoutBarriers[1].dstAccessMask = 0x100;
  this->m_imageLayoutBarriers[1].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[1].newLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[1].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].image.m_internal = dVar4;
  this->m_imageLayoutBarriers[1].subresourceRange.aspectMask = 1;
  this->m_imageLayoutBarriers[1].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[1].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.layerCount = 1;
  dVar4 = (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
          m_internal;
  this->m_imageLayoutBarriers[2].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[2].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[2].srcAccessMask = 0;
  this->m_imageLayoutBarriers[2].dstAccessMask = 0x400;
  this->m_imageLayoutBarriers[2].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[2].newLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[2].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[2].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[2].image.m_internal = dVar4;
  this->m_imageLayoutBarriers[2].subresourceRange.aspectMask = 2;
  this->m_imageLayoutBarriers[2].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[2].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[2].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[2].subresourceRange.layerCount = 1;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams._16_8_ = pipelineLayoutParams._16_8_ & 0xffffffff00000000;
  pipelineLayoutParams._36_4_ = this->m_colorFormat;
  pipelineLayoutParams.pushConstantRangeCount = 1;
  pipelineLayoutParams.pPushConstantRanges._0_4_ = 3;
  pipelineLayoutParams.pPushConstantRanges._4_4_ = 4;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&renderPassParams,(DeviceInterface *)pAlloc,
             device,(VkImageViewCreateInfo *)&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  this_04 = this->m_colorAttachmentView;
  subpassDescription.pInputAttachments = (VkAttachmentReference *)renderPassParams._16_8_;
  subpassDescription._24_8_ = renderPassParams.pAttachments;
  subpassDescription.flags = renderPassParams.sType;
  subpassDescription.pipelineBindPoint = renderPassParams._4_4_;
  subpassDescription._8_8_ = renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_04->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)subpassDescription.pInputAttachments;
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)subpassDescription._24_8_;
  (this_04->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       subpassDescription._0_8_;
  this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)subpassDescription._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&renderPassParams);
  pipelineLayoutParams.pSetLayouts =
       (VkDescriptorSetLayout *)
       (this_03->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&renderPassParams,(DeviceInterface *)pAlloc,
             device,(VkImageViewCreateInfo *)&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  subpassDescription.pInputAttachments = (VkAttachmentReference *)renderPassParams._16_8_;
  subpassDescription._24_8_ = renderPassParams.pAttachments;
  subpassDescription.flags = renderPassParams.sType;
  subpassDescription.pipelineBindPoint = renderPassParams._4_4_;
  subpassDescription._8_8_ = renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  this_05 = this->m_colorAttachmentView + 1;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_05->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)subpassDescription.pInputAttachments;
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)subpassDescription._24_8_;
  (this_05->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       subpassDescription._0_8_;
  this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)subpassDescription._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&renderPassParams);
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams._16_8_ = pipelineLayoutParams._16_8_ & 0xffffffff00000000;
  pipelineLayoutParams.pSetLayouts =
       (VkDescriptorSetLayout *)
       (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  pipelineLayoutParams._36_4_ = this->m_depthFormat;
  pipelineLayoutParams.pushConstantRangeCount = 1;
  pipelineLayoutParams.pPushConstantRanges._0_4_ = 3;
  pipelineLayoutParams.pPushConstantRanges._4_4_ = 4;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&renderPassParams,(DeviceInterface *)pAlloc,
             device,(VkImageViewCreateInfo *)&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  subpassDescription.pInputAttachments = (VkAttachmentReference *)renderPassParams._16_8_;
  subpassDescription._24_8_ = renderPassParams.pAttachments;
  subpassDescription.flags = renderPassParams.sType;
  subpassDescription.pipelineBindPoint = renderPassParams._4_4_;
  subpassDescription._8_8_ = renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)subpassDescription.pInputAttachments;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)subpassDescription._24_8_;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       subpassDescription._0_8_;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)subpassDescription._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&renderPassParams);
  attachmentBindInfos[0].m_internal =
       (this_04->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)attachmentBindInfos;
  attachmentBindInfos[1].m_internal =
       (this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams._16_8_ = pipelineLayoutParams._16_8_ & 0xffffffff00000000;
  pipelineLayoutParams.pSetLayouts =
       (VkDescriptorSetLayout *)
       (this_02->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal;
  pipelineLayoutParams.pushConstantRangeCount = 2;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&renderPassParams,(DeviceInterface *)pAlloc,
             device,(VkFramebufferCreateInfo *)&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  subpassDescription.pInputAttachments = (VkAttachmentReference *)renderPassParams._16_8_;
  subpassDescription._24_8_ = renderPassParams.pAttachments;
  subpassDescription.flags = renderPassParams.sType;
  subpassDescription.pipelineBindPoint = renderPassParams._4_4_;
  subpassDescription._8_8_ = renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)subpassDescription.pInputAttachments;
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)subpassDescription._24_8_;
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       subpassDescription._0_8_;
  this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)subpassDescription._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&renderPassParams);
  attachmentBindInfos[0].m_internal =
       (this_05->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&renderPassParams,(DeviceInterface *)pAlloc,
             device,(VkFramebufferCreateInfo *)&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  subpassDescription.pInputAttachments = (VkAttachmentReference *)renderPassParams._16_8_;
  subpassDescription._24_8_ = renderPassParams.pAttachments;
  subpassDescription.flags = renderPassParams.sType;
  subpassDescription.pipelineBindPoint = renderPassParams._4_4_;
  subpassDescription._8_8_ = renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)subpassDescription.pInputAttachments;
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)subpassDescription._24_8_;
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       subpassDescription._0_8_;
  this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)subpassDescription._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&renderPassParams);
  pVVar9 = Context::getDeviceFeatures((this->super_CacheTestInstance).super_TestInstance.m_context);
  VVar1 = pVVar9->geometryShader;
  VVar2 = pVVar9->tessellationShader;
  pcVar11 = (char *)0x0;
  do {
    pCVar5 = (this->super_CacheTestInstance).m_param;
    entryName = (char *)(ulong)(uint)pCVar5->m_shaderCount;
    if (entryName <= pcVar11) {
      pipelineLayoutParams.pNext = (void *)0x0;
      pipelineLayoutParams.pushConstantRangeCount = 0;
      pipelineLayoutParams._36_4_ = 0;
      pipelineLayoutParams.pPushConstantRanges._0_4_ = 0;
      pipelineLayoutParams.pPushConstantRanges._4_4_ = 0;
      pipelineLayoutParams.flags = 0;
      pipelineLayoutParams.setLayoutCount = 0;
      pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)0x0;
      pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
      pipelineLayoutParams._4_4_ = 0;
      ::vk::createPipelineLayout
                ((Move<vk::Handle<(vk::HandleType)16>_> *)&renderPassParams,
                 (DeviceInterface *)pAlloc,device,&pipelineLayoutParams,(VkAllocationCallbacks *)0x0
                );
      subpassDescription.pInputAttachments = (VkAttachmentReference *)renderPassParams._16_8_;
      subpassDescription._24_8_ = renderPassParams.pAttachments;
      subpassDescription.flags = renderPassParams.sType;
      subpassDescription.pipelineBindPoint = renderPassParams._4_4_;
      subpassDescription._8_8_ = renderPassParams.pNext;
      renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      renderPassParams._4_4_ = 0;
      renderPassParams.pNext = (void *)0x0;
      renderPassParams.flags = 0;
      renderPassParams.attachmentCount = 0;
      renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
                (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
      (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
      m_device = (VkDevice)subpassDescription.pInputAttachments;
      (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDescription._24_8_;
      (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
      m_internal = subpassDescription._0_8_;
      (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDescription._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&renderPassParams);
      tcu::Vector<unsigned_int,_2>::Vector(&local_38,&this->m_renderSize);
      SimpleGraphicsPipelineBuilder::buildPipeline
                ((Move<vk::Handle<(vk::HandleType)18>_> *)&subpassDescription,
                 (SimpleGraphicsPipelineBuilder *)this_01,&local_38,
                 (VkRenderPass)
                 (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                 m_internal,
                 (VkPipelineCache)
                 (this->super_CacheTestInstance).m_cache.
                 super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                 (VkPipelineLayout)
                 (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                 object.m_internal);
      pipelineLayoutParams._16_8_ = subpassDescription.pInputAttachments;
      pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)subpassDescription._24_8_;
      pipelineLayoutParams.sType = subpassDescription.flags;
      pipelineLayoutParams._4_4_ = subpassDescription.pipelineBindPoint;
      pipelineLayoutParams.pNext = (void *)subpassDescription._8_8_;
      subpassDescription.flags = 0;
      subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDescription.inputAttachmentCount = 0;
      subpassDescription._12_4_ = 0;
      subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDescription.colorAttachmentCount = 0;
      subpassDescription._28_4_ = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
                (&this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>);
      this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)pipelineLayoutParams._16_8_;
      this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)pipelineLayoutParams.pSetLayouts;
      this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           pipelineLayoutParams._0_8_;
      this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)pipelineLayoutParams.pNext;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&subpassDescription);
      tcu::Vector<unsigned_int,_2>::Vector(&local_40,&this->m_renderSize);
      SimpleGraphicsPipelineBuilder::buildPipeline
                ((Move<vk::Handle<(vk::HandleType)18>_> *)&subpassDescription,
                 (SimpleGraphicsPipelineBuilder *)this_01,&local_40,
                 (VkRenderPass)
                 (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                 m_internal,
                 (VkPipelineCache)
                 (this->super_CacheTestInstance).m_cache.
                 super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                 (VkPipelineLayout)
                 (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                 object.m_internal);
      pipelineLayoutParams._16_8_ = subpassDescription.pInputAttachments;
      pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)subpassDescription._24_8_;
      pipelineLayoutParams.sType = subpassDescription.flags;
      pipelineLayoutParams._4_4_ = subpassDescription.pipelineBindPoint;
      pipelineLayoutParams.pNext = (void *)subpassDescription._8_8_;
      subpassDescription.flags = 0;
      subpassDescription.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDescription.inputAttachmentCount = 0;
      subpassDescription._12_4_ = 0;
      subpassDescription.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDescription.colorAttachmentCount = 0;
      subpassDescription._28_4_ = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
                (&this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>);
      this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)pipelineLayoutParams._16_8_;
      this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)pipelineLayoutParams.pSetLayouts;
      this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           pipelineLayoutParams._0_8_;
      this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)pipelineLayoutParams.pNext;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&subpassDescription);
      return;
    }
    stage = pCVar5->m_shaders[(long)pcVar11];
    pcVar10 = "color_vert";
    switch(stage) {
    case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
      pcVar10 = "basic_tcs";
      if (VVar2 == 0) {
        this_06 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_06,"Tessellation Not Supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                   ,0x3fe);
LAB_004e6161:
        __cxa_throw(this_06,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      goto LAB_004e5ee6;
    case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
    case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
    case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
    case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
         VK_SHADER_STAGE_VERTEX_BIT:
      break;
    case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
      pcVar10 = "basic_tes";
      if (VVar2 == 0) {
        this_06 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_06,"Tessellation Not Supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                   ,0x409);
        goto LAB_004e6161;
      }
LAB_004e5ee6:
      SimpleGraphicsPipelineBuilder::bindShaderStage
                ((SimpleGraphicsPipelineBuilder *)this_01,stage,pcVar10,entryName);
      (this->m_pipelineBuilder).m_patchControlPoints = 3;
      break;
    case VK_SHADER_STAGE_GEOMETRY_BIT:
      pcVar10 = "dummy_geo";
      if (VVar1 == 0) {
        this_06 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_06,"Geometry Shader Not Supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                   ,0x3f4);
        goto LAB_004e6161;
      }
    case VK_SHADER_STAGE_VERTEX_BIT:
switchD_004e5eb5_caseD_1:
      SimpleGraphicsPipelineBuilder::bindShaderStage
                ((SimpleGraphicsPipelineBuilder *)this_01,stage,pcVar10,entryName);
      break;
    default:
      if (stage == VK_SHADER_STAGE_FRAGMENT_BIT) {
        pcVar10 = "color_frag";
        goto switchD_004e5eb5_caseD_1;
      }
    }
    pcVar11 = pcVar11 + 1;
  } while( true );
}

Assistant:

GraphicsCacheTestInstance::GraphicsCacheTestInstance (Context&              context,
													  const CacheTestParam* param)
	: CacheTestInstance (context,param)
	, m_renderSize      (32u, 32u)
	, m_colorFormat     (VK_FORMAT_R8G8B8A8_UNORM)
	, m_depthFormat     (VK_FORMAT_D16_UNORM)
	, m_pipelineBuilder (context)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create vertex buffer
	{
		m_vertexBuffer = createBufferAndBindMemory(m_context, 1024u, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT, &m_vertexBufferMemory);

		m_vertices          = createOverlappingQuads();
		// Load vertices into vertex buffer
		deMemcpy(m_vertexBufferMemory->getHostPtr(), m_vertices.data(), m_vertices.size() * sizeof(Vertex4RGBA));
		flushMappedMemoryRange(vk, vkDevice, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset(), 1024u);
	}

	// Create render pass
	{
		const VkAttachmentDescription colorAttachmentDescription =
		{
			0u,                                                 // VkAttachmentDescriptionFlags    flags;
			m_colorFormat,                                      // VkFormat                        format;
			VK_SAMPLE_COUNT_1_BIT,                              // VkSampleCountFlagBits           samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,                        // VkAttachmentLoadOp              loadOp;
			VK_ATTACHMENT_STORE_OP_STORE,                       // VkAttachmentStoreOp             storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,                    // VkAttachmentLoadOp              stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp             stencilStoreOp;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,           // VkImageLayout                   initialLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,           // VkImageLayout                   finalLayout;
		};

		const VkAttachmentDescription depthAttachmentDescription =
		{
			0u,                                                 // VkAttachmentDescriptionFlags flags;
			m_depthFormat,                                      // VkFormat                     format;
			VK_SAMPLE_COUNT_1_BIT,                              // VkSampleCountFlagBits        samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,                        // VkAttachmentLoadOp           loadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp          storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,                    // VkAttachmentLoadOp           stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp          stencilStoreOp;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,   // VkImageLayout                initialLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,   // VkImageLayout                finalLayout;
		};

		const VkAttachmentDescription attachments[2] =
		{
			colorAttachmentDescription,
			depthAttachmentDescription
		};

		const VkAttachmentReference colorAttachmentReference =
		{
			0u,                                                 // deUint32         attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL            // VkImageLayout    layout;
		};

		const VkAttachmentReference depthAttachmentReference =
		{
			1u,                                                 // deUint32         attachment;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL    // VkImageLayout    layout;
		};

		const VkSubpassDescription subpassDescription =
		{
			0u,                                                 // VkSubpassDescriptionFlags        flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,                    // VkPipelineBindPoint              pipelineBindPoint;
			0u,                                                 // deUint32                         inputAttachmentCount;
			DE_NULL,                                            // const VkAttachmentReference*     pInputAttachments;
			1u,                                                 // deUint32                         colorAttachmentCount;
			&colorAttachmentReference,                          // const VkAttachmentReference*     pColorAttachments;
			DE_NULL,                                            // const VkAttachmentReference*     pResolveAttachments;
			&depthAttachmentReference,                          // const VkAttachmentReference*     pDepthStencilAttachment;
			0u,                                                 // deUint32                         preserveAttachmentCount;
			DE_NULL                                             // const VkAttachmentReference*     pPreserveAttachments;
		};

		const VkRenderPassCreateInfo renderPassParams =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,          // VkStructureType                  sType;
			DE_NULL,                                            // const void*                      pNext;
			0u,                                                 // VkRenderPassCreateFlags          flags;
			2u,                                                 // deUint32                         attachmentCount;
			attachments,                                        // const VkAttachmentDescription*   pAttachments;
			1u,                                                 // deUint32                         subpassCount;
			&subpassDescription,                                // const VkSubpassDescription*      pSubpasses;
			0u,                                                 // deUint32                         dependencyCount;
			DE_NULL                                             // const VkSubpassDependency*       pDependencies;
		};

		m_renderPass = createRenderPass(vk, vkDevice, &renderPassParams);
	}

	const VkComponentMapping    ComponentMappingRGBA = { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A};
	// Create color image
	{
		m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE] = createImage2DAndBindMemory(m_context,
																			   m_colorFormat,
																			   m_renderSize.x(),
																			   m_renderSize.y(),
																			   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
																			   VK_SAMPLE_COUNT_1_BIT,
																			   &m_colorImageAlloc[PIPELINE_CACHE_NDX_NO_CACHE]);
		m_colorImage[PIPELINE_CACHE_NDX_CACHED]   = createImage2DAndBindMemory(m_context,
																			   m_colorFormat,
																			   m_renderSize.x(),
																			   m_renderSize.y(),
																			   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
																			   VK_SAMPLE_COUNT_1_BIT,
																			   &m_colorImageAlloc[PIPELINE_CACHE_NDX_CACHED]);
	}

	// Create depth image
	{
		m_depthImage = createImage2DAndBindMemory(m_context,
												  m_depthFormat,
												  m_renderSize.x(),
												  m_renderSize.y(),
												  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
												  VK_SAMPLE_COUNT_1_BIT,
												  &m_depthImageAlloc);
	}

	// Set up image layout transition barriers
	{
		VkImageMemoryBarrier colorImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],			// VkImage					image;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[0] = colorImageBarrier;

		colorImageBarrier.image = *m_colorImage[PIPELINE_CACHE_NDX_CACHED];
		m_imageLayoutBarriers[1] = colorImageBarrier;

		const VkImageMemoryBarrier depthImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_depthImage,										// VkImage					image;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[2] = depthImageBarrier;
	}
	// Create color attachment view
	{
		VkImageViewCreateInfo colorAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],     // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			m_colorFormat,                                  // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_colorAttachmentView[PIPELINE_CACHE_NDX_NO_CACHE] = createImageView(vk, vkDevice, &colorAttachmentViewParams);

		colorAttachmentViewParams.image = *m_colorImage[PIPELINE_CACHE_NDX_CACHED];
		m_colorAttachmentView[PIPELINE_CACHE_NDX_CACHED] = createImageView(vk, vkDevice, &colorAttachmentViewParams);
	}

	// Create depth attachment view
	{
		const VkImageViewCreateInfo depthAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_depthImage,                                  // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			m_depthFormat,                                  // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_depthAttachmentView = createImageView(vk, vkDevice, &depthAttachmentViewParams);
	}

	// Create framebuffer
	{
		VkImageView attachmentBindInfos[2] =
		{
			*m_colorAttachmentView[PIPELINE_CACHE_NDX_NO_CACHE],
			*m_depthAttachmentView,
		};

		const VkFramebufferCreateInfo framebufferParams =
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,          // VkStructureType              sType;
			DE_NULL,                                            // const void*                  pNext;
			0u,                                                 // VkFramebufferCreateFlags     flags;
			*m_renderPass,                                      // VkRenderPass                 renderPass;
			2u,                                                 // deUint32                     attachmentCount;
			attachmentBindInfos,                                // const VkImageView*           pAttachments;
			(deUint32)m_renderSize.x(),                         // deUint32                     width;
			(deUint32)m_renderSize.y(),                         // deUint32                     height;
			1u,                                                 // deUint32                     layers;
		};

		m_framebuffer[PIPELINE_CACHE_NDX_NO_CACHE] = createFramebuffer(vk, vkDevice, &framebufferParams);

		attachmentBindInfos[0] = *m_colorAttachmentView[PIPELINE_CACHE_NDX_CACHED];
		m_framebuffer[PIPELINE_CACHE_NDX_CACHED] = createFramebuffer(vk, vkDevice, &framebufferParams);
	}

	// Bind shader stages
	VkPhysicalDeviceFeatures  features = m_context.getDeviceFeatures();
	for (deUint32 shaderNdx = 0; shaderNdx < m_param->getShaderCount(); shaderNdx++)
	{
		switch(m_param->getShaderFlag(shaderNdx))
		{
			case VK_SHADER_STAGE_VERTEX_BIT:
				m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_VERTEX_BIT, "color_vert", "main");
				break;
			case VK_SHADER_STAGE_FRAGMENT_BIT:
				m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_FRAGMENT_BIT, "color_frag", "main");
				break;
			case VK_SHADER_STAGE_GEOMETRY_BIT:
				if (features.geometryShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Geometry Shader Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_GEOMETRY_BIT, "dummy_geo", "main");
				}
				break;
			case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
				if (features.tessellationShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Tessellation Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT, "basic_tcs", "main");
					m_pipelineBuilder.enableTessellationStage(3);
				}
				break;
			case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
				if (features.tessellationShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Tessellation Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, "basic_tes", "main");
					m_pipelineBuilder.enableTessellationStage(3);
				}
				break;
			default:
				DE_FATAL("Unknown Shader Stage!");
				break;
		};
	}

	// Create pipeline layout
	{
		const VkPipelineLayoutCreateInfo pipelineLayoutParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkPipelineLayoutCreateFlags		flags;
			0u,													// deUint32							setLayoutCount;
			DE_NULL,											// const VkDescriptorSetLayout*		pSetLayouts;
			0u,													// deUint32							pushConstantRangeCount;
			DE_NULL												// const VkPushConstantRange*		pPushConstantRanges;
		};

		m_pipelineLayout = createPipelineLayout(vk, vkDevice, &pipelineLayoutParams);
	}

	m_pipeline[PIPELINE_CACHE_NDX_NO_CACHE]	= m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass, *m_cache, *m_pipelineLayout);
	m_pipeline[PIPELINE_CACHE_NDX_CACHED]	= m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass, *m_cache, *m_pipelineLayout);
}